

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

void __thiscall
LinkedReadsDatastore::get_tags_kmers128(int,int,std::set<unsigned_int,std::less<unsigned_int>,std::
allocator<unsigned_int>>,ReadSequenceBuffer&,bool)::StreamKmerFactory128::
produce_all_kmers(char_const*,std::vector<unsigned__int128,std::allocator<unsigned__int128>_>__
          (void *this,char *seq,vector<unsigned___int128,_std::allocator<unsigned___int128>_> *mers)

{
  __uint128_t *rkmer;
  __uint128_t *fkmer;
  uchar b;
  __uint128_t *__args;
  
  rkmer = (__uint128_t *)((long)this + 0x10);
  fkmer = (__uint128_t *)((long)this + 0x20);
  *(undefined8 *)((long)this + 0x18) = 0;
  *(undefined8 *)((long)this + 0x20) = 0;
  *(undefined8 *)((long)this + 8) = 0;
  *(undefined8 *)((long)this + 0x10) = 0;
  *(undefined8 *)((long)this + 0x28) = 0;
  for (; (b = *seq, b != '\0' && (b != '\n')); seq = (char *)((uchar *)seq + 1)) {
    KMerFactory128::fillKBuf((KMerFactory128 *)this,b,rkmer,fkmer,(int64_t *)((long)this + 8));
    if ((long)(ulong)*this <= *(long *)((long)this + 8)) {
      __args = fkmer;
      if (*(ulong *)((long)this + 0x18) <= *(ulong *)((long)this + 0x28) &&
          (ulong)(*(ulong *)fkmer < *(ulong *)rkmer) <=
          *(ulong *)((long)this + 0x28) - *(ulong *)((long)this + 0x18)) {
        __args = rkmer;
      }
      std::vector<unsigned__int128,std::allocator<unsigned__int128>>::
      emplace_back<unsigned__int128&>
                ((vector<unsigned__int128,std::allocator<unsigned__int128>> *)mers,__args);
    }
  }
  return;
}

Assistant:

inline void produce_all_kmers(const char * seq, std::vector<__uint128_t> &mers){
            // TODO: Adjust for when K is larger than what fits in __uint128_t!
            last_unknown=0;
            fkmer=0;
            rkmer=0;
            auto s=seq;
            while (*s!='\0' and *s!='\n') {
                //fkmer: grows from the right (LSB)
                //rkmer: grows from the left (MSB)
                fillKBuf(*s, fkmer, rkmer, last_unknown);
                if (last_unknown >= K) {
                    if (fkmer <= rkmer) {
                        // Is fwd
                        mers.emplace_back(fkmer);
                    } else {
                        // Is bwd
                        mers.emplace_back(rkmer);
                    }
                }
                ++s;
            }
        }